

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O0

void __thiscall
nlohmann::detail::
serializer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
::dump_float(serializer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
             *this,number_float_t x)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  element_type *peVar4;
  pointer pvVar5;
  size_type sVar6;
  iterator pvVar7;
  char *pcVar8;
  iterator pvVar9;
  long in_RDI;
  double in_XMM0_Qa;
  bool value_is_int_like;
  char *dec_pos;
  char *end;
  ptrdiff_t len;
  char *in_stack_ffffffffffffff68;
  char *in_stack_ffffffffffffff70;
  char *in_stack_ffffffffffffff80;
  char *in_stack_ffffffffffffff88;
  char *pcVar10;
  char *in_stack_ffffffffffffff90;
  ulong local_18;
  
  bVar1 = std::isfinite(in_XMM0_Qa);
  if ((bVar1) && (uVar2 = std::isnan(in_XMM0_Qa), (uVar2 & 1) == 0)) {
    pvVar5 = std::array<char,_64UL>::data((array<char,_64UL> *)0x2182ff);
    sVar6 = std::array<char,_64UL>::size((array<char,_64UL> *)(in_RDI + 0x10));
    iVar3 = snprintf(pvVar5,sVar6,"%.*g",in_XMM0_Qa,0xf);
    local_18 = (ulong)iVar3;
    if ((long)local_18 < 1) {
      __assert_fail("len > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/BrychDaneel[P]WgForgeTrains/libs/nlohmann/json.hpp"
                    ,0x1a33,
                    "void nlohmann::detail::serializer<nlohmann::basic_json<>>::dump_float(number_float_t) [BasicJsonType = nlohmann::basic_json<>]"
                   );
    }
    sVar6 = std::array<char,_64UL>::size((array<char,_64UL> *)(in_RDI + 0x10));
    if (sVar6 <= local_18) {
      __assert_fail("static_cast<std::size_t>(len) < number_buffer.size()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/BrychDaneel[P]WgForgeTrains/libs/nlohmann/json.hpp"
                    ,0x1a35,
                    "void nlohmann::detail::serializer<nlohmann::basic_json<>>::dump_float(number_float_t) [BasicJsonType = nlohmann::basic_json<>]"
                   );
    }
    if (*(char *)(in_RDI + 0x58) != '\0') {
      std::array<char,_64UL>::begin((array<char,_64UL> *)0x2183d5);
      std::array<char,_64UL>::begin((array<char,_64UL> *)0x2183e8);
      in_stack_ffffffffffffff90 =
           std::remove<char*,char>
                     (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80)
      ;
      std::array<char,_64UL>::end((array<char,_64UL> *)0x218423);
      std::fill<char*,char>(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,(char *)0x21843a);
      pvVar7 = std::array<char,_64UL>::begin((array<char,_64UL> *)0x218452);
      if ((long)local_18 < (long)in_stack_ffffffffffffff90 - (long)pvVar7) {
        __assert_fail("(end - number_buffer.begin()) <= len",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/BrychDaneel[P]WgForgeTrains/libs/nlohmann/json.hpp"
                      ,0x1a3d,
                      "void nlohmann::detail::serializer<nlohmann::basic_json<>>::dump_float(number_float_t) [BasicJsonType = nlohmann::basic_json<>]"
                     );
      }
      pvVar7 = std::array<char,_64UL>::begin((array<char,_64UL> *)0x2184a0);
      local_18 = (long)in_stack_ffffffffffffff90 - (long)pvVar7;
    }
    if ((*(char *)(in_RDI + 0x59) != '\0') && (*(char *)(in_RDI + 0x59) != '.')) {
      pvVar7 = std::array<char,_64UL>::begin((array<char,_64UL> *)0x2184dd);
      std::array<char,_64UL>::end((array<char,_64UL> *)0x2184f0);
      pcVar8 = std::find<char*,char>(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,pvVar7);
      pcVar10 = pcVar8;
      pvVar7 = std::array<char,_64UL>::end((array<char,_64UL> *)0x218523);
      if (pcVar10 != pvVar7) {
        *pcVar8 = '.';
      }
    }
    peVar4 = std::
             __shared_ptr_access<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x218544);
    pvVar5 = std::array<char,_64UL>::data((array<char,_64UL> *)0x218557);
    (*peVar4->_vptr_output_adapter_protocol[1])(peVar4,pvVar5,local_18);
    pvVar7 = std::array<char,_64UL>::begin((array<char,_64UL> *)0x21857b);
    pvVar9 = std::array<char,_64UL>::begin((array<char,_64UL> *)0x21858e);
    bVar1 = std::
            none_of<char*,nlohmann::detail::serializer<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>::dump_float(double)::_lambda(char)_1_>
                      (pvVar7,pvVar9 + local_18 + 1);
    if (bVar1) {
      peVar4 = std::
               __shared_ptr_access<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x2185be);
      (*peVar4->_vptr_output_adapter_protocol[1])(peVar4,".0",2);
    }
  }
  else {
    peVar4 = std::
             __shared_ptr_access<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x2182d7);
    (*peVar4->_vptr_output_adapter_protocol[1])(peVar4,"null",4);
  }
  return;
}

Assistant:

void dump_float(number_float_t x)
    {
        // NaN / inf
        if (not std::isfinite(x) or std::isnan(x))
        {
            o->write_characters("null", 4);
            return;
        }

        // get number of digits for a text -> float -> text round-trip
        static constexpr auto d = std::numeric_limits<number_float_t>::digits10;

        // the actual conversion
        std::ptrdiff_t len = snprintf(number_buffer.data(), number_buffer.size(), "%.*g", d, x);

        // negative value indicates an error
        assert(len > 0);
        // check if buffer was large enough
        assert(static_cast<std::size_t>(len) < number_buffer.size());

        // erase thousands separator
        if (thousands_sep != '\0')
        {
            const auto end = std::remove(number_buffer.begin(),
                                         number_buffer.begin() + len, thousands_sep);
            std::fill(end, number_buffer.end(), '\0');
            assert((end - number_buffer.begin()) <= len);
            len = (end - number_buffer.begin());
        }

        // convert decimal point to '.'
        if (decimal_point != '\0' and decimal_point != '.')
        {
            const auto dec_pos = std::find(number_buffer.begin(), number_buffer.end(), decimal_point);
            if (dec_pos != number_buffer.end())
            {
                *dec_pos = '.';
            }
        }

        o->write_characters(number_buffer.data(), static_cast<std::size_t>(len));

        // determine if need to append ".0"
        const bool value_is_int_like =
            std::none_of(number_buffer.begin(), number_buffer.begin() + len + 1,
                         [](char c)
        {
            return (c == '.' or c == 'e');
        });

        if (value_is_int_like)
        {
            o->write_characters(".0", 2);
        }
    }